

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O1

void __thiscall
MIDISong2::MIDISong2(MIDISong2 *this,MIDISong2 *original,char *filename,EMidiDevice type)

{
  int iVar1;
  int iVar2;
  BYTE *__src;
  TrackInfo *pTVar3;
  BYTE *__dest;
  TrackInfo *pTVar4;
  ulong uVar5;
  ulong uVar6;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,filename,type);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__MIDISong2_006f44f8;
  this->SongLen = original->SongLen;
  iVar1 = original->SongLen;
  __dest = (BYTE *)operator_new__((long)iVar1);
  this->MusHeader = __dest;
  __src = original->MusHeader;
  memcpy(__dest,__src,(long)iVar1);
  this->Format = original->Format;
  iVar1 = original->NumTracks;
  uVar6 = (long)iVar1 << 6;
  this->NumTracks = iVar1;
  this->DesignationMask = 0;
  (this->super_MIDIStreamer).Division = (original->super_MIDIStreamer).Division;
  iVar2 = (original->super_MIDIStreamer).InitialTempo;
  (this->super_MIDIStreamer).InitialTempo = iVar2;
  (this->super_MIDIStreamer).Tempo = iVar2;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)iVar1) {
    uVar5 = uVar6;
  }
  pTVar4 = (TrackInfo *)operator_new__(uVar5);
  this->Tracks = pTVar4;
  if (0 < iVar1) {
    pTVar3 = original->Tracks;
    uVar5 = 0;
    do {
      *(BYTE **)((long)&pTVar4->TrackBegin + uVar5) =
           __dest + (*(long *)((long)&pTVar3->TrackBegin + uVar5) - (long)__src);
      *(undefined8 *)((long)&pTVar4->TrackP + uVar5) = 0;
      *(undefined8 *)((long)&pTVar4->MaxTrackP + uVar5) =
           *(undefined8 *)((long)&pTVar3->MaxTrackP + uVar5);
      uVar5 = uVar5 + 0x40;
    } while (uVar6 != uVar5);
  }
  return;
}

Assistant:

MIDISong2::MIDISong2(const MIDISong2 *original, const char *filename, EMidiDevice type)
: MIDIStreamer(filename, type)
{
	SongLen = original->SongLen;
	MusHeader = new BYTE[original->SongLen];
	memcpy(MusHeader, original->MusHeader, original->SongLen);
	Format = original->Format;
	NumTracks = original->NumTracks;
	DesignationMask = 0;
	Division = original->Division;
	Tempo = InitialTempo = original->InitialTempo;
	Tracks = new TrackInfo[NumTracks];
	for (int i = 0; i < NumTracks; ++i)
	{
		TrackInfo *newtrack = &Tracks[i];
		const TrackInfo *oldtrack = &original->Tracks[i];

		newtrack->TrackBegin = MusHeader + (oldtrack->TrackBegin - original->MusHeader);
		newtrack->TrackP = 0;
		newtrack->MaxTrackP = oldtrack->MaxTrackP;
	}
}